

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

void __thiscall
pstore::database::database<pstore::file::in_memory>
          (database *this,shared_ptr<pstore::file::in_memory> *file,bool access_tick_enabled)

{
  _Head_base<0UL,_pstore::system_page_size_interface_*,_false> local_40;
  _Head_base<0UL,_pstore::region::factory_*,_false> local_38;
  __uniq_ptr_impl<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_> local_30
  ;
  
  std::make_unique<pstore::system_page_size>();
  local_40._M_head_impl =
       (system_page_size_interface *)
       local_30._M_t.
       super__Tuple_impl<0UL,_pstore::system_page_size_*,_std::default_delete<pstore::system_page_size>_>
       .super__Head_base<0UL,_pstore::system_page_size_*,_false>._M_head_impl;
  local_30._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_*,_std::default_delete<pstore::system_page_size>_>
  .super__Head_base<0UL,_pstore::system_page_size_*,_false>._M_head_impl =
       (tuple<pstore::system_page_size_*,_std::default_delete<pstore::system_page_size>_>)
       (_Tuple_impl<0UL,_pstore::system_page_size_*,_std::default_delete<pstore::system_page_size>_>
       )0x0;
  region::get_factory((region *)&local_38,file,0x100000000,0x400000);
  database<pstore::file::in_memory>
            (this,file,
             (unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
              *)&local_40,
             (unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> *)
             &local_38,access_tick_enabled);
  if (local_38._M_head_impl != (factory *)0x0) {
    (*(local_38._M_head_impl)->_vptr_factory[1])();
  }
  if (local_40._M_head_impl != (system_page_size_interface *)0x0) {
    (*(local_40._M_head_impl)->_vptr_system_page_size_interface[1])();
  }
  local_40._M_head_impl = (system_page_size_interface *)0x0;
  std::unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>::
  ~unique_ptr((unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>
               *)&local_30);
  return;
}

Assistant:

explicit database (std::shared_ptr<File> const & file, bool access_tick_enabled = true)
                : database (file, std::make_unique<system_page_size> (),
                            region::get_factory (file, storage::full_region_size,
                                                 storage::min_region_size),
                            access_tick_enabled) {}